

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_traceinfo(lua_State *L)

{
  GCtrace *name;
  GCstr *pGVar1;
  GCtab *in_RDI;
  bool bVar2;
  GCtab *t;
  GCtrace *T;
  lua_State *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  lua_State *L_00;
  lua_State *in_stack_ffffffffffffff78;
  int32_t val;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  name = jit_checktrace(in_stack_ffffffffffffff68);
  bVar2 = name != (GCtrace *)0x0;
  if (bVar2) {
    lua_createtable(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                    (int)in_stack_ffffffffffffff70);
    val = 0;
    setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI,
                (char *)name,0);
    setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI,
                (char *)name,val);
    setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI,
                (char *)name,val);
    setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI,
                (char *)name,val);
    L_00 = *(lua_State **)&in_RDI->asize;
    *(MRef **)&in_RDI->asize = &L_00->glref;
    strlen(jit_trlinkname[name->linktype]);
    pGVar1 = lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    (L_00->nextgc).gcptr32 = (uint32_t)pGVar1;
    L_00->marked = 0xfb;
    L_00->gct = 0xff;
    L_00->dummy_ffid = 0xff;
    L_00->status = 0xff;
    lua_setfield(L_00,(int)((ulong)pGVar1 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  return (uint)bVar2;
}

Assistant:

LJLIB_CF(jit_util_traceinfo)
{
  GCtrace *T = jit_checktrace(L);
  if (T) {
    GCtab *t;
    lua_createtable(L, 0, 8);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "nins", (int32_t)T->nins - REF_BIAS - 1);
    setintfield(L, t, "nk", REF_BIAS - (int32_t)T->nk);
    setintfield(L, t, "link", T->link);
    setintfield(L, t, "nexit", T->nsnap);
    setstrV(L, L->top++, lj_str_newz(L, jit_trlinkname[T->linktype]));
    lua_setfield(L, -2, "linktype");
    /* There are many more fields. Add them only when needed. */
    return 1;
  }
  return 0;
}